

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::output_example_seq(vw *all,ldf *data,multi_ex *ec_seq)

{
  code *pcVar1;
  bool bVar2;
  reference ppeVar3;
  reference ppeVar4;
  wclass *pwVar5;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RSI;
  long *in_RDI;
  double dVar6;
  float correct_class_prob;
  float multiclass_log_loss;
  float ec_cost;
  size_t k;
  size_t correct_class_k;
  float min_cost;
  multi_ex *in_stack_00000098;
  v_array<char> empty;
  example *ec;
  iterator __end3;
  iterator __begin3;
  multi_ex *__range3;
  bool hit_loss;
  size_t K;
  multi_ex *in_stack_000001b8;
  bool *in_stack_000001c0;
  example *in_stack_000001c8;
  vw *in_stack_000001d0;
  ldf *in_stack_000001e0;
  multi_ex *in_stack_000001e8;
  bool *in_stack_000001f0;
  example *in_stack_000001f8;
  vw *in_stack_00000200;
  vector<example_*,_std::allocator<example_*>_> *in_stack_fffffffffffffeb8;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
  *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar7;
  ldf *in_stack_fffffffffffffef0;
  allocator *paVar8;
  float local_f8;
  ulong local_f0;
  size_type local_e8;
  float local_dc;
  allocator local_99;
  string local_98 [32];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  example *local_50;
  example **local_48;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_40;
  vector<example_*,_std::allocator<example_*>_> *local_38;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_30;
  undefined1 local_21;
  size_type local_20;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  long local_10;
  long *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  if ((local_20 != 0) && (bVar2 = ec_seq_is_label_definition(in_stack_00000098), !bVar2)) {
    bVar2 = test_ldf_sequence(in_stack_fffffffffffffef0,
                              (multi_ex *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (bVar2) {
      ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
      *(double *)(*local_8 + 0x30) = (double)(*ppeVar3)->weight + *(double *)(*local_8 + 0x30);
    }
    else {
      ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
      *(double *)(*local_8 + 0x20) = (double)(*ppeVar3)->weight + *(double *)(*local_8 + 0x20);
    }
    *(long *)(*local_8 + 8) = *(long *)(*local_8 + 8) + 1;
    local_21 = 0;
    if ((*(byte *)(local_10 + 200) & 1) == 0) {
      local_38 = local_18;
      local_40._M_current =
           (example **)
           std::vector<example_*,_std::allocator<example_*>_>::begin(in_stack_fffffffffffffeb8);
      local_48 = (example **)
                 std::vector<example_*,_std::allocator<example_*>_>::end(in_stack_fffffffffffffeb8);
      while (bVar2 = __gnu_cxx::operator!=
                               (in_stack_fffffffffffffec0,
                                (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                 *)in_stack_fffffffffffffeb8), bVar2) {
        ppeVar4 = __gnu_cxx::
                  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                  ::operator*(&local_40);
        local_50 = *ppeVar4;
        output_example(in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,
                       in_stack_000001e0);
        __gnu_cxx::
        __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
        operator++(&local_40);
      }
    }
    else {
      local_30._M_current =
           (example **)
           std::vector<example_*,_std::allocator<example_*>_>::begin(in_stack_fffffffffffffeb8);
      __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
      ::operator*(&local_30);
      output_rank_example(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
    }
    if (0 < (int)local_8[0x6a6]) {
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      pcVar1 = (code *)local_8[0x6a8];
      uVar7 = (undefined4)local_8[0x6a6];
      paVar8 = &local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"",paVar8);
      (*pcVar1)(uVar7,local_98);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    if ((*(byte *)(local_10 + 0xbb) & 1) != 0) {
      local_dc = 3.4028235e+38;
      local_e8 = 0;
      for (local_f0 = 0; local_f0 < local_20; local_f0 = local_f0 + 1) {
        ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,local_f0);
        pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                           ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar3)->l).simple,0);
        if (pwVar5->x < local_dc) {
          local_e8 = local_f0;
          local_dc = pwVar5->x;
        }
      }
      local_f8 = 999.0;
      ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,local_e8);
      if (0.0 < ((*ppeVar3)->pred).scalar) {
        dVar6 = std::log((double)(ulong)(uint)((*ppeVar3)->pred).scalar);
        local_f8 = -SUB84(dVar6,0);
      }
      if ((*(byte *)((long)local_8 + 0x3457) & 1) == 0) {
        *(double *)(*local_8 + 200) = (double)local_f8 + *(double *)(*local_8 + 200);
      }
      else {
        *(double *)(*local_8 + 0xc0) = (double)local_f8 + *(double *)(*local_8 + 0xc0);
      }
    }
  }
  return;
}

Assistant:

void output_example_seq(vw& all, ldf& data, multi_ex& ec_seq)
{
  size_t K = ec_seq.size();
  if ((K > 0) && !ec_seq_is_label_definition(ec_seq))
  {
    if (test_ldf_sequence(data, ec_seq))
      all.sd->weighted_unlabeled_examples += ec_seq[0]->weight;
    else
      all.sd->weighted_labeled_examples += ec_seq[0]->weight;
    all.sd->example_number++;

    bool hit_loss = false;
    if (data.rank)
      output_rank_example(all, **(ec_seq.begin()), hit_loss, &(ec_seq));
    else
      for (example* ec : ec_seq) output_example(all, *ec, hit_loss, &(ec_seq), data);

    if (all.raw_prediction > 0)
    {
      v_array<char> empty = {nullptr, nullptr, nullptr, 0};
      all.print_text(all.raw_prediction, "", empty);
    }

    if (data.is_probabilities)
    {
      float min_cost = FLT_MAX;
      size_t correct_class_k = 0;

      for (size_t k = 0; k < K; k++)
      {
        float ec_cost = ec_seq[k]->l.cs.costs[0].x;
        if (ec_cost < min_cost)
        {
          min_cost = ec_cost;
          correct_class_k = k;
        }
      }

      float multiclass_log_loss = 999;  // -log(0) = plus infinity
      float correct_class_prob = ec_seq[correct_class_k]->pred.prob;
      if (correct_class_prob > 0)
        multiclass_log_loss = -log(correct_class_prob);

      // TODO: How to detect if we should update holdout or normal loss?
      // (ec.test_only) OR (COST_SENSITIVE::example_is_test(ec))
      // What should be the "ec"? data.ec_seq[0]?
      // Based on parse_args.cc (where "average multiclass log loss") is printed,
      // I decided to try yet another way: (!all.holdout_set_off).
      if (!all.holdout_set_off)
        all.sd->holdout_multiclass_log_loss += multiclass_log_loss;
      else
        all.sd->multiclass_log_loss += multiclass_log_loss;
    }
  }
}